

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal_p.h
# Opt level: O3

Error __thiscall
asmjit::RALocalAllocator::onSaveReg
          (RALocalAllocator *this,uint32_t group,uint32_t workId,uint32_t physId)

{
  uint32_t *puVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  byte bVar5;
  Error EVar6;
  undefined8 in_RAX;
  undefined4 in_register_00000034;
  int *piVar7;
  ulong uVar8;
  
  piVar7 = (int *)CONCAT44(in_register_00000034,group);
  if (workId == 0xffffffff) {
    onSaveReg();
LAB_0011cf8b:
    onSaveReg();
LAB_0011cf90:
    onSaveReg();
LAB_0011cf95:
    onSaveReg();
  }
  else {
    if ((this->_curAssignment)._layout.workCount <= workId) goto LAB_0011cf8b;
    if ((this->_curAssignment)._workToPhysMap[workId].physIds[0] != physId) goto LAB_0011cf90;
    if (0x1f < physId) goto LAB_0011cf95;
    if ((this->_curAssignment)._physToWorkIds[group][physId] == workId) {
      if (group < 4) {
        bVar5 = (byte)physId & 0x1f;
        puVar1 = (((this->_curAssignment)._physToWorkMap)->dirty)._masks + group;
        *puVar1 = *puVar1 & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
        EVar6 = (*(this->_pass->super_FuncPass).super_Pass._vptr_Pass[0xc])
                          (this->_pass,(ulong)workId,(ulong)physId,in_RAX);
        return EVar6;
      }
      goto LAB_0011cf9f;
    }
  }
  onSaveReg();
LAB_0011cf9f:
  onSaveReg();
  if ((((*(int *)&this->_pass == *piVar7) && (*(int *)((long)&this->_pass + 4) == piVar7[1])) &&
      (uVar2 = *(uint *)&this->_cc, uVar2 == piVar7[2])) &&
     ((uVar3 = *(uint *)((long)&this->_cc + 4), uVar3 == piVar7[3] &&
      (this->_archTraits == *(ArchTraits **)(piVar7 + 4))))) {
    if ((ulong)uVar2 != 0) {
      uVar8 = 0;
      do {
        if (*(int *)(*(long *)((this->_availableRegs)._masks + 2) + 0x20 + uVar8 * 4) !=
            *(int *)(*(long *)(piVar7 + 8) + 0x20 + uVar8 * 4)) {
          return 0;
        }
        uVar8 = uVar8 + 1;
      } while (uVar2 != uVar8);
    }
    if ((ulong)uVar3 != 0) {
      uVar8 = 0;
      do {
        if (*(char *)(*(long *)(this->_availableRegs)._masks + uVar8) !=
            *(char *)(*(long *)(piVar7 + 6) + uVar8)) {
          return 0;
        }
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
    }
    piVar4 = *(int **)((this->_availableRegs)._masks + 2);
    piVar7 = *(int **)(piVar7 + 8);
    if (((*piVar4 == *piVar7) && (piVar4[1] == piVar7[1])) &&
       ((piVar4[2] == piVar7[2] &&
        ((((piVar4[3] == piVar7[3] && (piVar4[4] == piVar7[4])) && (piVar4[5] == piVar7[5])) &&
         ((piVar4[6] == piVar7[6] && (piVar4[7] == piVar7[7])))))))) {
      return (Error)CONCAT71((int7)((ulong)piVar4 >> 8),1);
    }
  }
  return 0;
}

Assistant:

inline Error onSaveReg(uint32_t group, uint32_t workId, uint32_t physId) noexcept {
    ASMJIT_ASSERT(_curAssignment.workToPhysId(group, workId) == physId);
    ASMJIT_ASSERT(_curAssignment.physToWorkId(group, physId) == workId);

    _curAssignment.makeClean(group, workId, physId);
    return _pass->emitSave(workId, physId);
  }